

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_bounding_sphere_xyz(REF_DBL *xyz,REF_INT n,REF_DBL *center,REF_DBL *radius)

{
  long lVar1;
  REF_DBL *pRVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  REF_DBL RVar7;
  double dVar8;
  
  lVar1 = 0;
  pRVar2 = xyz;
  do {
    center[lVar1] = 0.0;
    if (0 < n) {
      RVar7 = center[lVar1];
      lVar3 = 0;
      do {
        RVar7 = RVar7 + *(double *)((long)pRVar2 + lVar3);
        center[lVar1] = RVar7;
        lVar3 = lVar3 + 0x18;
      } while ((ulong)(uint)n * 0x18 != lVar3);
    }
    center[lVar1] = center[lVar1] / (double)n;
    lVar1 = lVar1 + 1;
    pRVar2 = pRVar2 + 1;
  } while (lVar1 != 3);
  *radius = 0.0;
  if (0 < n) {
    lVar1 = 0;
    do {
      dVar6 = *radius;
      dVar4 = *(double *)((long)xyz + lVar1) - *center;
      dVar8 = *(double *)((long)xyz + lVar1 + 8) - center[1];
      dVar5 = *(double *)((long)xyz + lVar1 + 0x10) - center[2];
      dVar4 = dVar5 * dVar5 + dVar8 * dVar8 + dVar4 * dVar4;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      if (dVar6 <= dVar4) {
        dVar6 = *(double *)((long)xyz + lVar1) - *center;
        dVar5 = *(double *)((long)xyz + lVar1 + 8) - center[1];
        dVar4 = *(double *)((long)xyz + lVar1 + 0x10) - center[2];
        dVar6 = dVar4 * dVar4 + dVar5 * dVar5 + dVar6 * dVar6;
        if (dVar6 < 0.0) {
          RVar7 = sqrt(dVar6);
        }
        else {
          RVar7 = SQRT(dVar6);
        }
      }
      else {
        RVar7 = *radius;
      }
      *radius = RVar7;
      lVar1 = lVar1 + 0x18;
    } while ((ulong)(uint)n * 0x18 != lVar1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_bounding_sphere_xyz(REF_DBL *xyz, REF_INT n,
                                                REF_DBL *center,
                                                REF_DBL *radius) {
  REF_INT i, j;
  for (i = 0; i < 3; i++) {
    center[i] = 0;
    for (j = 0; j < n; j++) {
      center[i] += xyz[i + 3 * j];
    }
    center[i] /= (REF_DBL)n;
  }
  *radius = 0.0;
  for (i = 0; i < n; i++)
    *radius = MAX(*radius, sqrt(pow(xyz[0 + 3 * i] - center[0], 2) +
                                pow(xyz[1 + 3 * i] - center[1], 2) +
                                pow(xyz[2 + 3 * i] - center[2], 2)));
  return REF_SUCCESS;
}